

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbitmap.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  char *__nptr;
  bool bVar2;
  char cVar3;
  undefined2 uVar4;
  int iVar5;
  uint uVar6;
  SDL_Surface *pSVar7;
  SDL_Surface *pSVar8;
  long lVar9;
  ulong uVar10;
  void *__s;
  int iVar11;
  int iVar12;
  SDL_Rect dst;
  SDL_Event event;
  SDL_Color palette [256];
  short local_458;
  short local_456;
  undefined2 local_454;
  undefined2 local_452;
  char local_450 [6];
  short sStack_44a;
  char local_438 [1032];
  
  iVar5 = SDL_Init(0x20);
  if (iVar5 < 0) {
    main_cold_4();
    return 1;
  }
  uVar6 = 0;
  if (1 < argc) {
    uVar6 = 0;
    do {
      uVar1 = argc - 1;
      iVar5 = strcmp(argv[(ulong)(uint)argc - 2],"-bpp");
      __nptr = argv[uVar1];
      if (iVar5 == 0) {
        uVar6 = atoi(__nptr);
        argc = argc - 2;
      }
      else {
        iVar5 = strcmp(__nptr,"-warp");
        argc = uVar1;
        if (((iVar5 != 0) && (iVar5 = strcmp(__nptr,"-hw"), iVar5 != 0)) &&
           (iVar5 = strcmp(__nptr,"-fullscreen"), iVar5 != 0)) {
          main_cold_1();
          goto LAB_0010170a;
        }
      }
    } while (1 < argc);
  }
  pSVar7 = (SDL_Surface *)SDL_SetVideoMode(0x280,0x1e0,uVar6 & 0xff);
  if (pSVar7 == (SDL_Surface *)0x0) {
LAB_0010170a:
    main_cold_3();
  }
  else {
    if ((uVar6 & 0xff) == 8) {
      cVar3 = -1;
      lVar9 = 0;
      do {
        local_438[lVar9 * 4] = cVar3;
        local_438[lVar9 * 4 + 1] = cVar3;
        local_438[lVar9 * 4 + 2] = cVar3;
        lVar9 = lVar9 + 1;
        cVar3 = cVar3 + -1;
      } while (lVar9 != 0x100);
      SDL_SetColors(pSVar7,local_438,0,0x100);
    }
    iVar5 = SDL_LockSurface(pSVar7);
    if (-1 < iVar5) {
      __s = pSVar7->pixels;
      iVar5 = pSVar7->h;
      if (pSVar7->format->BytesPerPixel == '\x02') {
        if (0 < iVar5) {
          iVar11 = 0;
          do {
            uVar10 = (long)(iVar11 * 0xff) / (long)iVar5 & 0xff;
            uVar4 = SDL_MapRGB(pSVar7->format,uVar10,uVar10);
            iVar5 = pSVar7->w;
            if (0 < (long)iVar5) {
              lVar9 = 0;
              do {
                *(undefined2 *)((long)__s + lVar9 * 2) = uVar4;
                lVar9 = lVar9 + 1;
              } while (iVar5 != lVar9);
            }
            __s = (void *)((long)__s + (ulong)pSVar7->pitch);
            iVar11 = iVar11 + 1;
            iVar5 = pSVar7->h;
          } while (iVar11 < iVar5);
        }
      }
      else if (0 < iVar5) {
        iVar11 = 0;
        iVar12 = 0;
        do {
          memset(__s,iVar11 / iVar5,(ulong)pSVar7->pitch);
          __s = (void *)((long)__s + (ulong)pSVar7->pitch);
          iVar12 = iVar12 + 1;
          iVar5 = pSVar7->h;
          iVar11 = iVar11 + 0xff;
        } while (iVar12 < iVar5);
      }
      SDL_UnlockSurface(pSVar7);
      bVar2 = false;
      pSVar8 = pSVar7;
      SDL_UpdateRect(pSVar7,0,0,0,0);
      pSVar8 = LoadXBM(pSVar8,0x20,0x20,(Uint8 *)picture_bits);
      if (pSVar8 != (SDL_Surface *)0x0) {
        do {
          while (iVar5 = SDL_PollEvent(local_450), iVar5 != 0) {
            if ((local_450[0] == '\x02') || (local_450[0] == '\f')) {
              bVar2 = true;
            }
            else if (local_450[0] == '\x05') {
              iVar5 = pSVar8->w;
              local_458 = (short)stack0xfffffffffffffbb4 -
                          (short)((uint)(iVar5 - (iVar5 >> 0x1f)) >> 1);
              iVar11 = pSVar8->h;
              local_456 = sStack_44a - (short)((uint)(iVar11 - (iVar11 >> 0x1f)) >> 1);
              local_454 = (undefined2)iVar5;
              local_452 = (undefined2)iVar11;
              SDL_UpperBlit(pSVar8,0,pSVar7,&local_458);
              SDL_UpdateRects(pSVar7,1,&local_458);
            }
          }
        } while (!bVar2);
        SDL_FreeSurface(pSVar8);
        SDL_Quit();
        return 0;
      }
      goto LAB_00101717;
    }
  }
  main_cold_2();
LAB_00101717:
  SDL_Quit();
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	SDL_Surface *screen;
	SDL_Surface *bitmap;
	Uint8  video_bpp;
	Uint32 videoflags;
	Uint8 *buffer;
	int i, k, done;
	SDL_Event event;
	Uint16 *buffer16;
        Uint16 color;
        Uint8  gradient;
	SDL_Color palette[256];


	/* Initialize SDL */
	if ( SDL_Init(SDL_INIT_VIDEO) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return(1);
	}

	video_bpp = 0;
	videoflags = SDL_SWSURFACE;
	while ( argc > 1 ) {
		--argc;
		if ( strcmp(argv[argc-1], "-bpp") == 0 ) {
			video_bpp = atoi(argv[argc]);
			--argc;
		} else
		if ( strcmp(argv[argc], "-warp") == 0 ) {
			videoflags |= SDL_HWPALETTE;
		} else
		if ( strcmp(argv[argc], "-hw") == 0 ) {
			videoflags |= SDL_HWSURFACE;
		} else
		if ( strcmp(argv[argc], "-fullscreen") == 0 ) {
			videoflags |= SDL_FULLSCREEN;
		} else {
			fprintf(stderr,
			"Usage: %s [-bpp N] [-warp] [-hw] [-fullscreen]\n",
								argv[0]);
			quit(1);
		}
	}

	/* Set 640x480 video mode */
	if ( (screen=SDL_SetVideoMode(640,480,video_bpp,videoflags)) == NULL ) {
		fprintf(stderr, "Couldn't set 640x480x%d video mode: %s\n",
						video_bpp, SDL_GetError());
		quit(2);
	}

	if (video_bpp==8) {
		/* Set a gray colormap, reverse order from white to black */
		for ( i=0; i<256; ++i ) {
			palette[i].r = 255-i;
			palette[i].g = 255-i;
			palette[i].b = 255-i;
		}
		SDL_SetColors(screen, palette, 0, 256);
	}

	/* Set the surface pixels and refresh! */
	if ( SDL_LockSurface(screen) < 0 ) {
		fprintf(stderr, "Couldn't lock the display surface: %s\n",
							SDL_GetError());
		quit(2);
	}
	buffer=(Uint8 *)screen->pixels;
	if (screen->format->BytesPerPixel!=2) {
        	for ( i=0; i<screen->h; ++i ) {
        		memset(buffer,(i*255)/screen->h, screen->pitch);
        		buffer += screen->pitch;
        	}
        }
        else
        {
		for ( i=0; i<screen->h; ++i ) {
			gradient=((i*255)/screen->h);
                        color = SDL_MapRGB(screen->format, gradient, gradient, gradient);
                        buffer16=(Uint16*)buffer;
                        for (k=0; k<screen->w; k++)
                        {
                            *(buffer16+k)=color;
                        }
			buffer += screen->pitch;
		}
        }
	SDL_UnlockSurface(screen);
	SDL_UpdateRect(screen, 0, 0, 0, 0);

	/* Load the bitmap */
	bitmap = LoadXBM(screen, picture_width, picture_height,
					(Uint8 *)picture_bits);
	if ( bitmap == NULL ) {
		quit(1);
	}

	/* Wait for a keystroke */
	done = 0;
	while ( !done ) {
		/* Check for events */
		while ( SDL_PollEvent(&event) ) {
			switch (event.type) {
				case SDL_MOUSEBUTTONDOWN: {
					SDL_Rect dst;

					dst.x = event.button.x - bitmap->w/2;
					dst.y = event.button.y - bitmap->h/2;
					dst.w = bitmap->w;
					dst.h = bitmap->h;
					SDL_BlitSurface(bitmap, NULL,
								screen, &dst);
					SDL_UpdateRects(screen,1,&dst);
					}
					break;
				case SDL_KEYDOWN:
					/* Any key press quits the app... */
					done = 1;
					break;
				case SDL_QUIT:
					done = 1;
					break;
				default:
					break;
			}
		}
	}
	SDL_FreeSurface(bitmap);
	SDL_Quit();
	return(0);
}